

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue * JSONRPCPSBTError(UniValue *__return_storage_ptr__,PSBTError err)

{
  int code;
  long in_FS_OFFSET;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  code = -8;
  if (err != UNSUPPORTED) {
    code = (uint)(err == SIGHASH_MISMATCH) * 3 + -0x19;
  }
  common::PSBTErrorString(&local_60,err);
  JSONRPCError(__return_storage_ptr__,code,&local_60.original);
  bilingual_str::~bilingual_str(&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue JSONRPCPSBTError(PSBTError err)
{
    return JSONRPCError(RPCErrorFromPSBTError(err), PSBTErrorString(err).original);
}